

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest44
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  Application *this_00;
  Application *this_01;
  Application *this_02;
  Application *this_03;
  Application *this_04;
  Application *this_05;
  undefined1 local_1d8 [88];
  FieldBase local_180;
  FieldBase local_128;
  FieldBase local_d0;
  FieldBase local_78;
  
  this_01 = (Application *)local_1d8;
  this_04 = (Application *)local_1d8;
  this_02 = (Application *)local_1d8;
  this_05 = (Application *)local_1d8;
  this_03 = (Application *)local_1d8;
  this_00 = this;
  queryOrigClOrdID((OrigClOrdID *)local_1d8,this);
  queryClOrdID((ClOrdID *)&local_78,this_00);
  querySide((Side *)&local_d0,this_00);
  FIX::TransactTime::TransactTime((TransactTime *)&local_128);
  queryOrdType((OrdType *)&local_180,this_00);
  FIX44::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,(OrigClOrdID *)local_1d8,(ClOrdID *)&local_78,(Side *)&local_d0,
             (TransactTime *)&local_128,(OrdType *)&local_180);
  FIX::FieldBase::~FieldBase(&local_180);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  FIX::CharField::CharField((CharField *)local_1d8,0x15,'1');
  local_1d8._0_8_ = &PTR__FieldBase_00161ea0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_1d8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  querySymbol((Symbol *)local_1d8,this_01);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_1d8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  pp_Var1 = (_func_int **)(local_1d8 + 0x10);
  local_1d8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"New price","");
  bVar2 = queryConfirm(this_04,(string *)local_1d8);
  if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
    this_02 = (Application *)(local_1d8._16_8_ + 1);
    operator_delete((void *)local_1d8._0_8_,(ulong)this_02);
  }
  if (bVar2) {
    queryPrice((Price *)local_1d8,this_02);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_1d8,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  }
  local_1d8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"New quantity","");
  bVar2 = queryConfirm(this_05,(string *)local_1d8);
  if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
    this_03 = (Application *)(local_1d8._16_8_ + 1);
    operator_delete((void *)local_1d8._0_8_,(ulong)this_03);
  }
  if (bVar2) {
    queryOrderQty((OrderQty *)local_1d8,this_03);
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_1d8,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  }
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX44::OrderCancelReplaceRequest Application::queryCancelReplaceRequest44() {
  FIX44::OrderCancelReplaceRequest
      cancelReplaceRequest(queryOrigClOrdID(), queryClOrdID(), querySide(), FIX::TransactTime(), queryOrdType());

  cancelReplaceRequest.set(FIX::HandlInst('1'));
  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}